

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O3

MessageModule * __thiscall
ki::protocol::dml::MessageManager::load_module(MessageManager *this,string *filepath)

{
  _Rb_tree_header *p_Var1;
  MessageModuleProtocolTypeMap *this_00;
  pointer *pppMVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  xml_node<char> *pxVar5;
  pointer pcVar6;
  iterator __position;
  MessageManager *pMVar7;
  MessageManager *pMVar8;
  char cVar9;
  undefined1 uVar10;
  uint8_t uVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  MessageModule *pMVar15;
  Record *this_01;
  MessageTemplate *pMVar16;
  Field<unsigned_char> *pFVar17;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar18;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar19;
  const_iterator cVar20;
  value_error *pvVar21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  xml_node<char> *pxVar24;
  ulong uVar25;
  bool bVar26;
  MessageModule *message_module;
  string message_name;
  ostringstream oss_1;
  ifstream ifs;
  xml_document<char> doc;
  MessageModule *pMStack_105f0;
  string sStack_105e8;
  char *pcStack_105c8;
  MessageManager *pMStack_105c0;
  string sStack_105b8;
  string sStack_10598;
  string sStack_10578;
  string sStack_10558;
  string sStack_10538;
  string sStack_10518;
  string sStack_104f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
  apStack_104d8 [9];
  string sStack_10360;
  string sStack_10340;
  string asStack_10320 [2];
  string sStack_102e0;
  char acStack_102c0 [520];
  xml_document<char> xStack_100b8;
  
  pMStack_105c0 = this;
  std::ifstream::ifstream(acStack_102c0,(string *)filepath,_S_ate);
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&xStack_100b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&xStack_100b8,"Could not open file: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&xStack_100b8,(filepath->_M_dataplus)._M_p,filepath->_M_string_length);
    pvVar21 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    value_error::value_error(pvVar21,&sStack_102e0,MISSING_FILE);
    __cxa_throw(pvVar21,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar13 = std::istream::tellg();
  std::istream::seekg((long)acStack_102c0,_S_beg);
  uVar25 = 0xffffffffffffffff;
  if (lVar13 + 1U != 0) {
    uVar25 = lVar13 + 1U;
  }
  pcVar14 = (char *)operator_new__(uVar25);
  *pcVar14 = '\0';
  memset(pcVar14 + 1,0,uVar25 - 1);
  std::istream::read(acStack_102c0,(long)pcVar14);
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  xStack_100b8.super_xml_node<char>.m_type = node_document;
  xStack_100b8.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  xStack_100b8.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  xStack_100b8.super_memory_pool<char>.m_end =
       (char *)&xStack_100b8.super_memory_pool<char>.m_alloc_func;
  xStack_100b8.super_memory_pool<char>.m_begin =
       xStack_100b8.super_memory_pool<char>.m_static_memory;
  xStack_100b8.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  xStack_100b8.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  xStack_100b8.super_memory_pool<char>.m_ptr = xStack_100b8.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>(&xStack_100b8,pcVar14);
  pMVar15 = (MessageModule *)operator_new(200);
  sStack_104f8._M_dataplus._M_p = (pointer)&sStack_104f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_104f8);
  MessageModule::MessageModule(pMVar15,'\0',&sStack_104f8);
  pcStack_105c8 = pcVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_104f8._M_dataplus._M_p != &sStack_104f8.field_2) {
    operator_delete(sStack_104f8._M_dataplus._M_p);
  }
  pxVar24 = (xStack_100b8.super_xml_node<char>.m_first_node)->m_first_node;
  pMStack_105f0 = pMVar15;
  if (pxVar24 != (xml_node<char> *)0x0) {
    do {
      pxVar5 = pxVar24->m_first_node;
      if (pxVar5 != (xml_node<char> *)0x0) {
        this_01 = (Record *)operator_new(0x50);
        ki::dml::Record::Record(this_01);
        ki::dml::Record::from_xml(this_01,pxVar5);
        pcVar14 = (pxVar24->super_xml_base<char>).m_name;
        if (pcVar14 == (char *)0x0) {
          pcVar14 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string((string *)&sStack_105e8,pcVar14,(allocator *)apStack_104d8);
        iVar12 = std::__cxx11::string::compare((char *)&sStack_105e8);
        if (iVar12 == 0) {
          sStack_10518._M_dataplus._M_p = (pointer)&sStack_10518.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10518,"ServiceID","");
          pFVar17 = ki::dml::Record::get_field<unsigned_char>(this_01,&sStack_10518);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10518._M_dataplus._M_p != &sStack_10518.field_2) {
            operator_delete(sStack_10518._M_dataplus._M_p);
          }
          sStack_10538._M_dataplus._M_p = (pointer)&sStack_10538.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_10538,"ProtocolType","")
          ;
          pFVar18 = ki::dml::Record::get_field<std::__cxx11::string>(this_01,&sStack_10538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10538._M_dataplus._M_p != &sStack_10538.field_2) {
            operator_delete(sStack_10538._M_dataplus._M_p);
          }
          sStack_10558._M_dataplus._M_p = (pointer)&sStack_10558.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sStack_10558,"ProtocolDescription","");
          pFVar19 = ki::dml::Record::get_field<std::__cxx11::string>(this_01,&sStack_10558);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10558._M_dataplus._M_p != &sStack_10558.field_2) {
            operator_delete(sStack_10558._M_dataplus._M_p);
          }
          if (pFVar17 != (Field<unsigned_char> *)0x0) {
            MessageModule::set_service_id(pMVar15,pFVar17->m_value);
          }
          if (pFVar18 !=
              (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            sStack_10598._M_dataplus._M_p = (pointer)&sStack_10598.field_2;
            pcVar6 = (pFVar18->m_value)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&sStack_10598,pcVar6,pcVar6 + (pFVar18->m_value)._M_string_length);
            MessageModule::set_protocol_type(pMVar15,&sStack_10598);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_10598._M_dataplus._M_p != &sStack_10598.field_2) {
              operator_delete(sStack_10598._M_dataplus._M_p);
            }
          }
          if (pFVar19 !=
              (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            sStack_105b8._M_dataplus._M_p = (pointer)&sStack_105b8.field_2;
            pcVar6 = (pFVar19->m_value)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&sStack_105b8,pcVar6,pcVar6 + (pFVar19->m_value)._M_string_length);
            MessageModule::set_protocol_description(pMVar15,&sStack_105b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_105b8._M_dataplus._M_p != &sStack_105b8.field_2) {
              operator_delete(sStack_105b8._M_dataplus._M_p);
            }
          }
        }
        else {
          if ((pxVar24->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) goto LAB_0015a0cc;
          pxVar5 = pxVar24->m_next_sibling;
          sStack_10578._M_dataplus._M_p = (pointer)&sStack_10578.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_10578,sStack_105e8._M_dataplus._M_p,
                     sStack_105e8._M_dataplus._M_p + sStack_105e8._M_string_length);
          pMVar16 = MessageModule::add_message_template
                              (pMVar15,&sStack_10578,this_01,pxVar5 == (xml_node<char> *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10578._M_dataplus._M_p != &sStack_10578.field_2) {
            operator_delete(sStack_10578._M_dataplus._M_p);
          }
          if (pMVar16 == (MessageTemplate *)0x0) {
            operator_delete__(pcStack_105c8);
            MessageModule::~MessageModule(pMVar15);
            operator_delete(pMVar15);
            ki::dml::Record::~Record(this_01);
            operator_delete(this_01);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)apStack_104d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)apStack_104d8,"Failed to create message template for ",0x26);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)apStack_104d8,sStack_105e8._M_dataplus._M_p,
                       sStack_105e8._M_string_length);
            pvVar21 = (value_error *)__cxa_allocate_exception(0x18);
            std::__cxx11::stringbuf::str();
            value_error::value_error(pvVar21,asStack_10320,NONE);
            __cxa_throw(pvVar21,&value_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_105e8._M_dataplus._M_p != &sStack_105e8.field_2) {
          operator_delete(sStack_105e8._M_dataplus._M_p);
        }
      }
      if ((pxVar24->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
LAB_0015a0cc:
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/libki/third_party/rapidxml.hpp"
                      ,0x3ee,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
      pxVar24 = pxVar24->m_next_sibling;
    } while (pxVar24 != (xml_node<char> *)0x0);
  }
  uVar10 = MessageModule::get_service_id(pMVar15);
  pMVar7 = pMStack_105c0;
  p_Var22 = (pMStack_105c0->m_service_id_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
  ;
  if (p_Var22 != (_Base_ptr)0x0) {
    p_Var1 = &(pMStack_105c0->m_service_id_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var23 = &p_Var1->_M_header;
    do {
      bVar26 = (byte)(char)p_Var22[1]._M_color < (byte)uVar10;
      if (!bVar26) {
        p_Var23 = p_Var22;
      }
      p_Var22 = (&p_Var22->_M_left)[bVar26];
    } while (p_Var22 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var23 != p_Var1) && ((byte)(char)p_Var23[1]._M_color <= (byte)uVar10))
    {
      operator_delete__(pcStack_105c8);
      MessageModule::~MessageModule(pMVar15);
      operator_delete(pMVar15);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)apStack_104d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)apStack_104d8,"Message Module has already been loaded with Service ID ",
                 0x37);
      MessageModule::get_service_id(pMVar15);
      std::ostream::_M_insert<unsigned_long>((ulong)apStack_104d8);
      pvVar21 = (value_error *)__cxa_allocate_exception(0x18);
      std::__cxx11::stringbuf::str();
      value_error::value_error(pvVar21,&sStack_10340,OVERWRITES_LOOKUP);
      __cxa_throw(pvVar21,&value_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  MessageModule::get_protocol_type_abi_cxx11_(&apStack_104d8[0].first,pMVar15);
  this_00 = &pMVar7->m_protocol_type_map;
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
           ::find(&this_00->_M_t,&apStack_104d8[0].first);
  paVar4 = &apStack_104d8[0].first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apStack_104d8[0].first._M_dataplus._M_p != paVar4) {
    operator_delete(apStack_104d8[0].first._M_dataplus._M_p);
  }
  pMVar8 = pMStack_105c0;
  pcVar14 = pcStack_105c8;
  if ((_Rb_tree_header *)cVar20._M_node !=
      &(pMVar7->m_protocol_type_map)._M_t._M_impl.super__Rb_tree_header) {
    operator_delete__(pcStack_105c8);
    MessageModule::~MessageModule(pMVar15);
    operator_delete(pMVar15);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)apStack_104d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)apStack_104d8,"Message Module has already been loaded with Protocol Type "
               ,0x3a);
    MessageModule::get_protocol_type_abi_cxx11_(&sStack_105e8,pMVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)apStack_104d8,sStack_105e8._M_dataplus._M_p,sStack_105e8._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_105e8._M_dataplus._M_p != &sStack_105e8.field_2) {
      operator_delete(sStack_105e8._M_dataplus._M_p);
    }
    pvVar21 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::stringbuf::str();
    value_error::value_error(pvVar21,&sStack_10360,OVERWRITES_LOOKUP);
    __cxa_throw(pvVar21,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __position._M_current =
       (pMStack_105c0->m_modules).
       super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pMStack_105c0->m_modules).
      super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ki::protocol::dml::MessageModule*,std::allocator<ki::protocol::dml::MessageModule*>>
    ::_M_realloc_insert<ki::protocol::dml::MessageModule*const&>
              ((vector<ki::protocol::dml::MessageModule*,std::allocator<ki::protocol::dml::MessageModule*>>
                *)pMStack_105c0,__position,&pMStack_105f0);
    pMVar15 = pMStack_105f0;
  }
  else {
    *__position._M_current = pMVar15;
    pppMVar2 = &(pMStack_105c0->m_modules).
                super__Vector_base<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar2 = *pppMVar2 + 1;
  }
  uVar11 = MessageModule::get_service_id(pMVar15);
  apStack_104d8[0].first._M_dataplus._M_p._0_1_ = uVar11;
  apStack_104d8[0].first._M_string_length = (size_type)pMStack_105f0;
  std::
  _Rb_tree<unsigned_char,std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>>
  ::_M_insert_unique<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>
            ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,ki::protocol::dml::MessageModule*>>>
              *)&pMVar8->m_service_id_map,
             (pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*> *)apStack_104d8);
  MessageModule::get_protocol_type_abi_cxx11_(&sStack_105e8,pMStack_105f0);
  paVar3 = &sStack_105e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_105e8._M_dataplus._M_p == paVar3) {
    apStack_104d8[0].first.field_2._8_8_ = sStack_105e8.field_2._8_8_;
    apStack_104d8[0].first._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    apStack_104d8[0].first._M_dataplus._M_p = sStack_105e8._M_dataplus._M_p;
  }
  apStack_104d8[0].first._M_string_length = sStack_105e8._M_string_length;
  sStack_105e8._M_string_length = 0;
  sStack_105e8.field_2._M_local_buf[0] = '\0';
  apStack_104d8[0].second = pMStack_105f0;
  sStack_105e8._M_dataplus._M_p = (pointer)paVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::protocol::dml::MessageModule*>>>
              *)this_00,apStack_104d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apStack_104d8[0].first._M_dataplus._M_p != paVar4) {
    operator_delete(apStack_104d8[0].first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_105e8._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_105e8._M_dataplus._M_p);
  }
  operator_delete__(pcVar14);
  pMVar15 = pMStack_105f0;
  rapidxml::memory_pool<char>::clear(&xStack_100b8.super_memory_pool<char>);
  std::ifstream::~ifstream(acStack_102c0);
  return pMVar15;
}

Assistant:

const MessageModule *MessageManager::load_module(std::string filepath)
	{
		// Open the file
		std::ifstream ifs(filepath, std::ios::ate);
		if (!ifs.is_open())
		{
			std::ostringstream oss;
			oss << "Could not open file: " << filepath;
			throw value_error(oss.str(), value_error::MISSING_FILE);
		}

		// Load contents into memory
		size_t size = ifs.tellg();
		ifs.seekg(0, std::ios::beg);
		char *data = new char[size + 1] { 0 };
		ifs.read(data, size);

		// Parse the contents
		rapidxml::xml_document<> doc;
		try
		{
			doc.parse<0>(data);
		}
		catch (rapidxml::parse_error &e)
		{
			delete[] data;

			std::ostringstream oss;
			oss << "Failed to parse: " << filepath;
			throw parse_error(oss.str(), parse_error::INVALID_XML_DATA);
		}

		// It's safe to allocate the module we're working on now
		auto *message_module = new MessageModule();

		// Get the root node and iterate through children
		// Each child is a MessageTemplate
		auto *root = doc.first_node();
		for (auto *node = root->first_node();
			node; node = node->next_sibling())
		{
			// Parse the record node inside this node
			auto *record_node = node->first_node();
			if (!record_node)
				continue;
			auto *record = new ki::dml::Record();
			record->from_xml(record_node);

			// The message name is initially based on the element name
			const std::string message_name = node->name();
			if (message_name == "_ProtocolInfo")
			{
				auto *service_id_field = record->get_field<ki::dml::UBYT>("ServiceID");
				auto *type_field = record->get_field<ki::dml::STR>("ProtocolType");
				auto *description_field = record->get_field<ki::dml::STR>("ProtocolDescription");

				// Set the module metadata from this template
				if (service_id_field)
					message_module->set_service_id(service_id_field->get_value());
				if (type_field)
					message_module->set_protocol_type(type_field->get_value());
				if (description_field)
					message_module->set_protocol_description(description_field->get_value());
			}
			else
			{
				// Only do sorting after we've reached the final message
				// This only affects modules that aren't ordered with _MsgOrder.
				const bool auto_sort = node->next_sibling() == nullptr;

				// The template will use the record itself to figure out name and type;
				// we only give the XML data incase the record doesn't have it defined.
				auto *message_template = message_module->add_message_template(message_name, record, auto_sort);
				if (!message_template)
				{
					delete[] data;
					delete message_module;
					delete record;

					std::ostringstream oss;
					oss << "Failed to create message template for ";
					oss << message_name;
					throw value_error(oss.str());
				}
			}
		}

		// Make sure we aren't overwriting another module
		if (m_service_id_map.count(message_module->get_service_id()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Service ID ";
			oss << (uint16_t)message_module->get_service_id();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		if (m_protocol_type_map.count(message_module->get_protocol_type()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Protocol Type ";
			oss << message_module->get_protocol_type();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		// Add it to our maps
		m_modules.push_back(message_module);
		m_service_id_map.insert({ message_module->get_service_id(), message_module });
		m_protocol_type_map.insert({ message_module->get_protocol_type(), message_module });

		delete[] data;
		return message_module;
	}